

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  char **extraout_RDX;
  skiwi *this;
  string local_68;
  skiwi_parameters local_48 [56];
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Game of life","");
  wh = create_window(&local_68,0x200,0x200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  scm_randomize();
  skiwi::skiwi_parameters::skiwi_parameters(local_48);
  skiwi::scheme_with_skiwi();
  this = (skiwi *)0x0;
  skiwi::skiwi_repl((skiwi *)0x0,0,extraout_RDX);
  skiwi::skiwi_quit(this);
  scm_stop();
  close_window(&wh);
  return 0;
}

Assistant:

int main()
  {  
  wh = create_window("Game of life", 512, 512); // create window for visualization
  scm_randomize(); // fill grid cells at random  
  skiwi::scheme_with_skiwi(&register_functions); // start scheme compiler skiwi
  skiwi::skiwi_repl(); // start the skiwi repl
  skiwi::skiwi_quit(); // clean up skiwi
  scm_stop(); // stop the game thread
  close_window(wh); // close the visualization window

  return 0;
  }